

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O0

int64 floatx80_to_int64(floatx80 a)

{
  int64 iVar1;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  bits64 local_40;
  bits64 aSigExtra;
  bits64 aSig;
  int local_28;
  int32 shiftCount;
  int32 aExp;
  flag aSign;
  floatx80 a_local;
  
  a_00.low = a.low;
  aExp._0_2_ = a.high;
  a_00._2_6_ = 0;
  a_00.high = (ushort)aExp;
  a_local._0_8_ = a_00.low;
  aSigExtra = extractFloatx80Frac(a_00);
  a_01._2_6_ = 0;
  a_01.high = (ushort)aExp;
  a_01.low = a_local._0_8_;
  local_28 = extractFloatx80Exp(a_01);
  a_02._2_6_ = 0;
  a_02.high = (ushort)aExp;
  a_02.low = a_local._0_8_;
  shiftCount._3_1_ = extractFloatx80Sign(a_02);
  aSig._4_4_ = 0x403e - local_28;
  if (aSig._4_4_ < 1) {
    if (aSig._4_4_ != 0) {
      float_raise('\x01');
      if ((shiftCount._3_1_ != '\0') && ((local_28 != 0x7fff || (aSigExtra == 0x8000000000000000))))
      {
        return -0x8000000000000000;
      }
      return 0x7fffffffffffffff;
    }
    local_40 = 0;
  }
  else {
    shift64ExtraRightJamming(aSigExtra,0,(int16)aSig._4_4_,&aSigExtra,&local_40);
  }
  iVar1 = roundAndPackInt64(shiftCount._3_1_,aSigExtra,local_40);
  return iVar1;
}

Assistant:

int64 floatx80_to_int64( floatx80 a )
{
	flag aSign;
	int32 aExp, shiftCount;
	bits64 aSig, aSigExtra;

	aSig = extractFloatx80Frac( a );
	aExp = extractFloatx80Exp( a );
	aSign = extractFloatx80Sign( a );
	shiftCount = 0x403E - aExp;
	if ( shiftCount <= 0 ) {
		if ( shiftCount ) {
			float_raise( float_flag_invalid );
			if (    ! aSign
					|| (    ( aExp == 0x7FFF )
						&& ( aSig != LIT64( 0x8000000000000000 ) ) )
				) {
				return LIT64( 0x7FFFFFFFFFFFFFFF );
			}
			return (sbits64) LIT64( 0x8000000000000000 );
		}
		aSigExtra = 0;
	}
	else {
		shift64ExtraRightJamming( aSig, 0, shiftCount, &aSig, &aSigExtra );
	}
	return roundAndPackInt64( aSign, aSig, aSigExtra );

}